

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Encode.cpp
# Opt level: O2

void idx2::EncodeBrick(idx2_file *Idx2,params *P,encode_data *E,bool IncrementLevel)

{
  grid *SbGrid;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  byte *pbVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  char cVar10;
  u64 uVar11;
  bool IncrementLevel_00;
  undefined7 in_register_00000009;
  brick_volume *Key;
  char *pcVar12;
  int iVar13;
  uint uVar14;
  i64 *this;
  char cVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  v3i Brick3;
  extent ToGrid;
  u64 PKey;
  brick_volume *local_110;
  v3<int> *local_108;
  v3i *local_100;
  brick_volume *local_f8;
  int *local_f0;
  ulong local_e8;
  int *local_e0;
  ulong local_d8;
  array<idx2::subband> *local_d0;
  grid SbGridNonExt;
  u64 local_b0;
  iterator PbIt;
  extent local_60;
  iterator BIt;
  
  cVar10 = (P->Meta).Field[0x2c] + (char)E;
  (P->Meta).Field[0x2c] = cVar10;
  if ('\x0f' < cVar10) {
    pcVar12 = 
    "t &idx2::stack_array<unsigned long, 16>::operator[](int) const [t = unsigned long, N = 16]";
LAB_0016da30:
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,pcVar12);
  }
  lVar18 = (long)cVar10;
  this = &(P->NasaMask).Buffer.Bytes;
  local_110 = (brick_volume *)(*(long *)((P->Meta).Field + lVar18 * 8 + 0x34) * 0x10 + lVar18);
  SbGridNonExt.super_extent.From = (u64)local_110;
  Lookup<unsigned_long,idx2::brick_volume>
            (&BIt,(idx2 *)this,(hash_table<unsigned_long,_idx2::brick_volume> *)&SbGridNonExt,
             (unsigned_long *)CONCAT71(in_register_00000009,IncrementLevel));
  uVar11 = ((BIt.Val)->ExtentLocal).Dims;
  SbGridNonExt.super_extent.From =
       (long)(uVar11 << 0x16) >> 0xb & 0xffffffff00000000U |
       (ulong)(uint)((long)(uVar11 << 0x2b) >> 0x2b);
  SbGridNonExt.super_extent.Dims =
       CONCAT44(SbGridNonExt.super_extent.Dims._4_4_,(int)((long)(uVar11 * 2) >> 0x2b));
  ExtrapolateCdf53((v3i *)&SbGridNonExt,Idx2->TransformOrder,&(BIt.Val)->Vol);
  uVar16 = (int)cVar10 + 1;
  local_100 = &Idx2->BrickDimsExt3;
  local_d0 = &Idx2->Subbands;
  ForwardCdf53(local_100,(int)(P->Meta).Field[0x2c],local_d0,&Idx2->TransformDetails,&(BIt.Val)->Vol
               ,uVar16 == (int)Idx2->NLevels);
  local_e0 = &P->BitPlanesPerFile + lVar18 * 3;
  local_e8 = (ulong)(int)uVar16;
  local_f0 = &P->BitPlanesPerFile + local_e8 * 3;
  Key = (brick_volume *)(long)(char)uVar16;
  local_108 = (Idx2->NBricks3).Arr + lVar18;
  cVar15 = '\0';
  local_f8 = Key;
  local_d8 = (ulong)uVar16;
  do {
    uVar9 = local_e8;
    if ((Idx2->Subbands).Size == (long)cVar15) {
      Dealloc(&(BIt.Val)->Vol);
      PbIt.Key = (unsigned_long *)local_110;
      Delete<unsigned_long,idx2::brick_volume>
                ((iterator *)&SbGridNonExt,(idx2 *)this,
                 (hash_table<unsigned_long,_idx2::brick_volume> *)&PbIt,(unsigned_long *)Key);
      pcVar12 = (P->Meta).Field + 0x2c;
      *pcVar12 = *pcVar12 - (char)E;
      return;
    }
    pbVar6 = (local_d0->Buffer).Data;
    lVar18 = (long)cVar15 * 0x40;
    SbGrid = (grid *)(pbVar6 + lVar18);
    lVar18 = *(long *)(pbVar6 + lVar18 + 8);
    iVar13 = (int)((lVar18 << 0x16) >> 0x2b);
    if ((cVar15 == '\0') && ((int)local_d8 < Idx2->NLevels)) {
      if (cVar10 == '\x0f') {
        pcVar12 = 
        "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
        ;
        goto LAB_0016da30;
      }
      uVar17 = (int)((lVar18 << 0x2b) >> 0x2b) - (uint)(1 < (lVar18 << 0x2b) >> 0x2b);
      uVar16 = iVar13 - (uint)(1 < iVar13);
      iVar13 = *local_e0;
      iVar1 = local_e0[1];
      iVar2 = (int)((extent *)(local_e0 + 2))->From;
      uVar14 = (int)(lVar18 * 2 >> 0x2b) - (uint)(1 < lVar18 * 2 >> 0x2b);
      uVar7 = (long)iVar13 / (long)(Idx2->GroupBrick3).field_0.field_0.X;
      uVar8 = (long)iVar2 / (long)(Idx2->GroupBrick3).field_0.field_0.Z;
      *(ulong *)local_f0 =
           (long)iVar1 / (long)(Idx2->GroupBrick3).field_0.field_0.Y << 0x20 | uVar7 & 0xffffffff;
      *(int *)&((extent *)(local_f0 + 2))->From = (int)uVar8;
      Brick3.field_0._0_8_ = uVar8 & 0xffffffff;
      Brick3.field_0.field_0.Z = iVar2;
      uVar11 = GetLinearBrick((idx2 *)Idx2,(idx2_file *)(local_e8 & 0xffffffff),(int)uVar7,Brick3);
      *(u64 *)((P->Meta).Field + uVar9 * 8 + 0x34) = uVar11;
      PKey = (u64)(&(local_f8->Vol).Buffer.Data + uVar11 * 2);
      Lookup<unsigned_long,idx2::brick_volume>
                (&PbIt,(idx2 *)this,(hash_table<unsigned_long,_idx2::brick_volume> *)&PKey,
                 (unsigned_long *)P);
      if ((PbIt.Ht)->Stats[PbIt.Idx] != Occupied) {
        brick_volume::brick_volume((brick_volume *)&SbGridNonExt);
        Resize((volume *)&SbGridNonExt,local_100,float64,(allocator *)(P->NasaMask).Buffer.Data);
        for (lVar18 = 0;
            ((long)(local_b0 << 0x16) >> 0x2b) * ((long)(local_b0 * 2) >> 0x2b) *
            ((long)(local_b0 << 0x2b) >> 0x2b) * 8 != lVar18; lVar18 = lVar18 + 8) {
          *(undefined8 *)(SbGridNonExt.super_extent.From + lVar18) = 0;
        }
        uVar3 = (Idx2->GroupBrick3).field_0.field_0.X;
        uVar4 = (Idx2->GroupBrick3).field_0.field_0.Y;
        uVar5 = (Idx2->GroupBrick3).field_0.field_0.Z;
        ToGrid.From = (ulong)(iVar2 - iVar2 % (int)uVar5 & 0x1fffff) << 0x2a |
                      (ulong)(iVar1 - iVar1 % (int)uVar4 & 0x1fffff) << 0x15 |
                      (ulong)(iVar13 - iVar13 % (int)uVar3 & 0x1fffff);
        ToGrid.Dims = (ulong)(uVar5 & 0x1fffff) << 0x2a |
                      ((ulong)uVar4 & 0x1fffff) << 0x15 | (ulong)uVar3 & 0x1fffff;
        local_60.From = 0;
        local_60.Dims =
             (ulong)((local_108->field_0).field_0.Z & 0x1fffff) << 0x2a |
             ((ulong)(uint)(local_108->field_0).field_0.Y & 0x1fffff) << 0x15 |
             (ulong)(uint)(local_108->field_0).field_0.X & 0x1fffff;
        Crop<idx2::extent,idx2::extent>(&ToGrid,&local_60);
        Insert<unsigned_long,idx2::brick_volume>(&PbIt,&PKey,(brick_volume *)&SbGridNonExt);
      }
      SbGridNonExt.super_extent.From = (SbGrid->super_extent).From;
      SbGridNonExt.Strd = SbGrid->Strd;
      ToGrid.Dims = (ulong)(uVar14 & 0x1fffff) << 0x2a |
                    (ulong)(uVar16 & 0x1fffff) << 0x15 | (ulong)(uVar17 & 0x1fffff);
      ToGrid.From = (ulong)((iVar2 % (Idx2->GroupBrick3).field_0.field_0.Z) * uVar14 & 0x1fffff) <<
                    0x2a | (ulong)((iVar1 % (Idx2->GroupBrick3).field_0.field_0.Y) * uVar16 &
                                  0x1fffff) << 0x15 |
                           (ulong)((iVar13 % (Idx2->GroupBrick3).field_0.field_0.X) * uVar17 &
                                  0x1fffff);
      SbGridNonExt.super_extent.Dims = ToGrid.Dims;
      CopyGridExtent<double,double>(&SbGridNonExt,&(BIt.Val)->Vol,&ToGrid,&(PbIt.Val)->Vol);
      IncrementLevel_00 = (bool)((PbIt.Val)->NChildrenDecoded + '\x01');
      (PbIt.Val)->NChildrenDecoded = IncrementLevel_00;
      if (IncrementLevel_00 == (bool)(PbIt.Val)->NChildrenMax) {
        EncodeBrick(Idx2,P,(encode_data *)0x1,IncrementLevel_00);
      }
    }
    (P->Meta).Field[0x2d] = cVar15;
    Key = BIt.Val;
    EncodeSubband(Idx2,(encode_data *)P,SbGrid,&(BIt.Val)->Vol);
    cVar15 = cVar15 + '\x01';
  } while( true );
}

Assistant:

static void
EncodeBrick(idx2_file* Idx2, const params& P, encode_data* E, bool IncrementLevel = false)
{
  idx2_Assert(Idx2->NLevels <= idx2_file::MaxLevels);

  i8 Level = E->Level += IncrementLevel;

  u64 Brick = E->Brick[Level];
  //printf(
  //  "level %d brick " idx2_PrStrV3i " %" PRIu64 "\n", Iter, idx2_PrV3i(E->Bricks3[Iter]), Brick);
  auto BIt = Lookup(E->BrickPool, GetBrickKey(Level, Brick));
  idx2_Assert(BIt);
  volume& BVol = BIt.Val->Vol;
  idx2_Assert(BVol.Buffer);

  // TODO: we do not need to pre-extrapolate, instead just compute and store the extrapolated values
  ExtrapolateCdf53(Dims(BIt.Val->ExtentLocal), Idx2->TransformOrder, &BVol);

  /* do wavelet transform */
  bool CoarsestLevel = Level + 1 == Idx2->NLevels; // only normalize
  ForwardCdf53(Idx2->BrickDimsExt3, E->Level, Idx2->Subbands, Idx2->TransformDetails, &BVol, CoarsestLevel);

  /* recursively encode the brick, one subband at a time */
  idx2_For (i8, Sb, 0, Size(Idx2->Subbands))
  { // subband loop
    const subband& S = Idx2->Subbands[Sb];
    v3i SbDimsNonExt3 = idx2_NonExtDims(Dims(S.Grid));
    i8 NextLevel = Level + 1;
    if (Sb == 0 && NextLevel < Idx2->NLevels)
    { // need to encode the parent brick
      /* find the parent brick and create it if not found */
      v3i Brick3 = E->Bricks3[Level];
      v3i PBrick3 = (E->Bricks3[NextLevel] = Brick3 / Idx2->GroupBrick3);
      u64 PBrick = (E->Brick[NextLevel] = GetLinearBrick(*Idx2, NextLevel, PBrick3));
      u64 PKey = GetBrickKey(NextLevel, PBrick);
      auto PbIt = Lookup(E->BrickPool, PKey);
      if (!PbIt)
      { // instantiate the parent brick in the hash table
        brick_volume PBrickVol;
        Resize(&PBrickVol.Vol, Idx2->BrickDimsExt3, dtype::float64, E->Alloc);
        Fill(idx2_Range(f64, PBrickVol.Vol), 0.0);
        v3i From3 = (Brick3 / Idx2->GroupBrick3) * Idx2->GroupBrick3;
        v3i NChildren3 =
          Dims(Crop(extent(From3, Idx2->GroupBrick3), extent(Idx2->NBricks3[Level])));
        PBrickVol.NChildrenMax = (i8)Prod(NChildren3);
        PBrickVol.ExtentLocal = extent(NChildren3 * SbDimsNonExt3);
        Insert(&PbIt, PKey, PBrickVol);
      }
      /* copy data to the parent brick and (optionally) encode it */
      v3i LocalBrickPos3 = Brick3 % Idx2->GroupBrick3;
      grid SbGridNonExt = S.Grid;
      SetDims(&SbGridNonExt, SbDimsNonExt3);
      extent ToGrid(LocalBrickPos3 * SbDimsNonExt3, SbDimsNonExt3);
      CopyGridExtent<f64, f64>(SbGridNonExt, BVol, ToGrid, &PbIt.Val->Vol);
      //      Copy(SbGridNonExt, BVol, ToGrid, &PbIt.Val->Vol);
      bool LastChild = ++PbIt.Val->NChildrenDecoded == PbIt.Val->NChildrenMax;
      if (LastChild)
        EncodeBrick(Idx2, P, E, true);
    } // end Sb == 0 && NextIteration < Idx2->NLevels
    E->Subband = Sb;
    EncodeSubband(Idx2, E, S.Grid, &BVol);
  } // end subband loop
  Dealloc(&BVol);
  Delete(&E->BrickPool, GetBrickKey(Level, Brick));
  E->Level -= IncrementLevel;
}